

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

Pair * __thiscall TagVecOfTags::pair(Pair *__return_storage_ptr__,TagVecOfTags *this)

{
  (__return_storage_ptr__->m_stringValue)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_stringValue).field_2;
  (__return_storage_ptr__->m_stringValue)._M_string_length = 0;
  (__return_storage_ptr__->m_stringValue).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->m_intValue = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->m_intValue = (this->m_intValue).m_value;
  return __return_storage_ptr__;
}

Assistant:

Configuration::Pair
TagVecOfTags::pair() const
{
	Configuration::Pair pair;

	pair.m_stringValue = m_stringValue.value();
	pair.m_intValue = m_intValue.value();

	return pair;
}